

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O3

void appendBasicRowsToBasis(HighsLp *lp,SimplexBasis *basis,HighsInt XnumNewRow)

{
  size_type sVar1;
  size_type __new_size;
  
  if (XnumNewRow != 0) {
    __new_size = (long)XnumNewRow + (long)lp->num_row_;
    sVar1 = (long)lp->num_col_ + (long)(int)__new_size;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize(&basis->nonbasicFlag_,sVar1);
    std::vector<signed_char,_std::allocator<signed_char>_>::resize(&basis->nonbasicMove_,sVar1);
    std::vector<int,_std::allocator<int>_>::resize(&basis->basicIndex_,__new_size);
    sVar1 = (size_type)lp->num_row_;
    if (lp->num_row_ < (int)__new_size) {
      do {
        (basis->nonbasicFlag_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
        .super__Vector_impl_data._M_start[sVar1 + (long)lp->num_col_] = '\0';
        (basis->nonbasicMove_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
        .super__Vector_impl_data._M_start[sVar1 + (long)lp->num_col_] = '\0';
        (basis->basicIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[sVar1] = lp->num_col_ + (int)sVar1;
        sVar1 = sVar1 + 1;
      } while (__new_size != sVar1);
    }
  }
  return;
}

Assistant:

void appendBasicRowsToBasis(HighsLp& lp, SimplexBasis& basis,
                            HighsInt XnumNewRow) {
  // Add basic logicals
  if (XnumNewRow == 0) return;

  HighsInt newNumRow = lp.num_row_ + XnumNewRow;
  HighsInt newNumTot = lp.num_col_ + newNumRow;
  basis.nonbasicFlag_.resize(newNumTot);
  basis.nonbasicMove_.resize(newNumTot);
  basis.basicIndex_.resize(newNumRow);
  // Make the new rows basic
  for (HighsInt iRow = lp.num_row_; iRow < newNumRow; iRow++) {
    basis.nonbasicFlag_[lp.num_col_ + iRow] = kNonbasicFlagFalse;
    basis.nonbasicMove_[lp.num_col_ + iRow] = 0;
    basis.basicIndex_[iRow] = lp.num_col_ + iRow;
  }
}